

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_SetLoadCuts(Kf_Cut_t *pCuts,int *pIntCuts)

{
  int iVar1;
  Kf_Cut_t *pKVar2;
  float fVar3;
  int local_34;
  int *piStack_30;
  int nCuts;
  int *pIntCut;
  int k;
  Kf_Cut_t *pCut;
  int *pIntCuts_local;
  Kf_Cut_t *pCuts_local;
  
  piStack_30 = pIntCuts + 2;
  for (local_34 = 0; local_34 < *pIntCuts; local_34 = local_34 + 1) {
    pKVar2 = pCuts + local_34;
    pKVar2->Sign = 0;
    pKVar2->Polar = 0;
    pKVar2->iFunc = piStack_30[*piStack_30 + 1];
    pKVar2->Delay = piStack_30[*piStack_30 + 2];
    fVar3 = Abc_Int2Float(piStack_30[*piStack_30 + 3]);
    pKVar2->Area = fVar3;
    pKVar2->nLeaves = *piStack_30;
    for (pIntCut._4_4_ = 0; pIntCut._4_4_ < *piStack_30; pIntCut._4_4_ = pIntCut._4_4_ + 1) {
      iVar1 = Abc_Lit2Var(piStack_30[pIntCut._4_4_ + 1]);
      pKVar2->pLeaves[pIntCut._4_4_] = iVar1;
      pKVar2->Sign = 1L << ((byte)pKVar2->pLeaves[pIntCut._4_4_] & 0x3f) | pKVar2->Sign;
      iVar1 = Abc_LitIsCompl(piStack_30[pIntCut._4_4_ + 1]);
      if (iVar1 != 0) {
        pKVar2->Polar = 1 << ((byte)pIntCut._4_4_ & 0x1f) | pKVar2->Polar;
      }
    }
    piStack_30 = piStack_30 + (*piStack_30 + 4);
  }
  return local_34;
}

Assistant:

static inline int Kf_SetLoadCuts( Kf_Cut_t * pCuts, int * pIntCuts )
{
    Kf_Cut_t * pCut;
    int k, * pIntCut, nCuts = 0; 
    Kf_ObjForEachCutInt( pIntCuts, pIntCut, nCuts )
    {
        pCut = pCuts + nCuts;
        pCut->Sign  = 0;
        pCut->Polar = 0;
        pCut->iFunc = pIntCut[pIntCut[0] + 1];
        pCut->Delay = pIntCut[pIntCut[0] + 2];
        pCut->Area  = Abc_Int2Float(pIntCut[pIntCut[0] + 3]);
        pCut->nLeaves = pIntCut[0];    
        for ( k = 0; k < pIntCut[0]; k++ )
        {
            pCut->pLeaves[k] = Abc_Lit2Var(pIntCut[k+1]);
            pCut->Sign |= ((word)1) << (pCut->pLeaves[k] & 0x3F);
            if ( Abc_LitIsCompl(pIntCut[k+1]) )
                pCut->Polar |= (1 << k);
        }
    }
    return nCuts;
}